

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O2

void __thiscall
ProductFormUpdate::setup(ProductFormUpdate *this,HighsInt num_row,double expected_density)

{
  size_type __n;
  int local_14;
  
  this->valid_ = true;
  this->num_row_ = num_row;
  this->update_count_ = 0;
  local_14 = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->start_,&local_14);
  __n = (size_type)(int)((double)(num_row * 0x32) * expected_density + 1000.0);
  std::vector<int,_std::allocator<int>_>::reserve(&this->index_,__n);
  std::vector<double,_std::allocator<double>_>::reserve(&this->value_,__n);
  return;
}

Assistant:

void ProductFormUpdate::setup(const HighsInt num_row,
                              const double expected_density) {
  valid_ = true;
  num_row_ = num_row;
  update_count_ = 0;
  start_.push_back(0);
  HighsInt reserve_entry_space =
      kProductFormExtraEntries +
      kProductFormMaxUpdates * num_row * expected_density;
  index_.reserve(reserve_entry_space);
  value_.reserve(reserve_entry_space);
}